

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v7::detail::format_uint<3u,char,unsigned__int128>
                 (char *buffer,unsigned___int128 value,int num_digits,bool upper)

{
  int in_ECX;
  undefined7 in_register_00000011;
  undefined4 in_register_00000034;
  uint digit;
  char *digits;
  char *end;
  bool upper_local;
  int num_digits_local;
  unsigned___int128 value_local;
  char *buffer_local;
  
  value_local._0_8_ = CONCAT44(in_register_00000034,num_digits);
  value_local._8_8_ = CONCAT71(in_register_00000011,upper);
  buffer_local = buffer + in_ECX;
  do {
    buffer_local[-1] = ((byte)(ulong)value_local & 7) + 0x30;
    value_local._0_8_ = value_local._8_8_ << 0x3d | (ulong)value_local >> 3;
    value_local._8_8_ = value_local._8_8_ >> 3;
    buffer_local = buffer_local + -1;
  } while ((ulong)value_local != 0 || value_local._8_8_ != 0);
  return buffer + in_ECX;
}

Assistant:

inline Char* format_uint(Char* buffer, UInt value, int num_digits,
                         bool upper = false) {
  buffer += num_digits;
  Char* end = buffer;
  do {
    const char* digits = upper ? "0123456789ABCDEF" : "0123456789abcdef";
    unsigned digit = (value & ((1 << BASE_BITS) - 1));
    *--buffer = static_cast<Char>(BASE_BITS < 4 ? static_cast<char>('0' + digit)
                                                : digits[digit]);
  } while ((value >>= BASE_BITS) != 0);
  return end;
}